

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
Expand<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Level>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  CrtAllocator *pCVar1;
  char *pcVar2;
  char *pcVar3;
  char *newCapacity;
  
  pcVar2 = this->stack_;
  if (pcVar2 == (char *)0x0) {
    if (this->allocator_ == (CrtAllocator *)0x0) {
      pCVar1 = (CrtAllocator *)operator_new(1);
      this->allocator_ = pCVar1;
      this->ownAllocator_ = pCVar1;
    }
    pcVar3 = (char *)this->initialCapacity_;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar3 = this->stackEnd_ + (((ulong)(this->stackEnd_ + (1 - (long)pcVar2)) >> 1) - (long)pcVar2)
    ;
  }
  newCapacity = this->stackTop_ + (count * 0x10 - (long)pcVar2);
  if (this->stackTop_ + (count * 0x10 - (long)pcVar2) < pcVar3) {
    newCapacity = pcVar3;
  }
  Resize(this,(size_t)newCapacity);
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator());
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }